

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman.cpp
# Opt level: O3

void __thiscall CHuffman::Init(CHuffman *this,uint *pFrequencies)

{
  unsigned_short *puVar1;
  int i;
  ulong uVar2;
  int iVar3;
  CNode *pCVar4;
  uint *pFrequencies_00;
  ulong uVar5;
  
  mem_zero(this,0x4020);
  pFrequencies_00 = gs_aFreqTable;
  if (pFrequencies != (uint *)0x0) {
    pFrequencies_00 = pFrequencies;
  }
  ConstructTree(this,pFrequencies_00);
  uVar2 = 0;
  do {
    pCVar4 = this->m_pStartNode;
    iVar3 = 10;
    uVar5 = uVar2 & 0xffffffff;
    do {
      puVar1 = pCVar4->m_aLeafs;
      pCVar4 = this->m_aNodes + puVar1[(uint)uVar5 & 1];
      if (this->m_aNodes[puVar1[(uint)uVar5 & 1]].m_NumBits != 0) break;
      uVar5 = uVar5 >> 1;
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
    this->m_apDecodeLut[uVar2] = pCVar4;
    uVar2 = uVar2 + 1;
    if (uVar2 == 0x400) {
      return;
    }
  } while( true );
}

Assistant:

void CHuffman::Init(const unsigned *pFrequencies)
{
	// make sure to cleanout every thing
	mem_zero(this, sizeof(*this));

	// construct the tree
	if(!pFrequencies)
		pFrequencies = gs_aFreqTable;
	ConstructTree(pFrequencies);

	// build decode LUT
	for(int i = 0; i < HUFFMAN_LUTSIZE; i++)
	{
		unsigned Bits = i;
		int k;
		CNode *pNode = m_pStartNode;
		for(k = 0; k < HUFFMAN_LUTBITS; k++)
		{
			pNode = &m_aNodes[pNode->m_aLeafs[Bits&1]];
			Bits >>= 1;

			if(!pNode)
				break;

			if(pNode->m_NumBits)
			{
				m_apDecodeLut[i] = pNode;
				break;
			}
		}

		if(k == HUFFMAN_LUTBITS)
			m_apDecodeLut[i] = pNode;
	}

}